

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O0

Aig_Man_t * Aig_ManReduceLaches(Aig_Man_t *p,int fVerbose)

{
  int iVar1;
  Vec_Ptr_t *vMap_00;
  Aig_Man_t *p_00;
  int nCur;
  int nSaved;
  Vec_Ptr_t *vMap;
  Aig_Man_t *pTemp;
  Aig_Man_t *pAStack_10;
  int fVerbose_local;
  Aig_Man_t *p_local;
  
  pAStack_10 = p;
  if (fVerbose != 0) {
    printf("Performing combinational register sweep:\n");
    pAStack_10 = p;
  }
  do {
    iVar1 = Aig_ManReduceLachesCount(pAStack_10);
    if (iVar1 == 0) {
      return pAStack_10;
    }
    vMap_00 = Aig_ManReduceLachesOnce(pAStack_10);
    p_00 = Aig_ManRemap(pAStack_10,vMap_00);
    Vec_PtrFree(vMap_00);
    Aig_ManSeqCleanup(p_00);
    if (fVerbose != 0) {
      Aig_ManReportImprovement(pAStack_10,p_00);
    }
    Aig_ManStop(pAStack_10);
    pAStack_10 = p_00;
  } while (p_00->nRegs != 0);
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManReduceLaches( Aig_Man_t * p, int fVerbose )
{
    Aig_Man_t * pTemp;
    Vec_Ptr_t * vMap;
    int nSaved, nCur;
    if ( fVerbose )
        printf( "Performing combinational register sweep:\n" );
    for ( nSaved = 0; (nCur = Aig_ManReduceLachesCount(p)); nSaved += nCur )
    {
//        printf( "Reducible = %d\n", nCur );
        vMap = Aig_ManReduceLachesOnce( p );
        p = Aig_ManRemap( pTemp = p, vMap );
        Vec_PtrFree( vMap );
        Aig_ManSeqCleanup( p );
        if ( fVerbose )
            Aig_ManReportImprovement( pTemp, p );
        Aig_ManStop( pTemp );
        if ( p->nRegs == 0 )
            break;
    }
    return p;
}